

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong *in_RCX;
  ulong *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  GCobj *uvo;
  GCproto *pt;
  GCfunc *fn;
  char *local_8;
  
  if (in_RDI[1] == 0xfffffff7) {
    uVar2 = (ulong)*in_RDI;
    if (*(char *)(uVar2 + 6) == '\0') {
      uVar1 = *(uint *)(uVar2 + 0x10);
      if (in_ESI < *(byte *)((ulong)uVar1 - 0x1c)) {
        uVar2 = (ulong)*(uint *)(uVar2 + 0x14 + (ulong)in_ESI * 4);
        *in_RDX = (ulong)*(uint *)(uVar2 + 0x10);
        *in_RCX = uVar2;
        pcVar3 = lj_debug_uvname((GCproto *)((ulong)uVar1 - 0x40),in_ESI);
        return pcVar3;
      }
    }
    else if (in_ESI < *(byte *)(uVar2 + 7)) {
      *in_RDX = uVar2 + 0x20 + (ulong)in_ESI * 8;
      *in_RCX = uVar2;
      local_8 = "";
      return local_8;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}